

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

ITracker * __thiscall Catch::TestCaseTracking::TrackerContext::startRun(TrackerContext *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  SectionTracker *pSVar2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  undefined1 local_89;
  SectionTracker *local_88;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_80;
  long *local_78;
  long local_70;
  long local_68 [2];
  NameAndLocation local_58;
  void *local_28;
  
  local_78 = local_68;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"{root}","");
  paVar1 = &local_58.name.field_2;
  local_58.name._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>((string *)&local_58,local_78,local_70 + (long)local_78);
  local_58.location.file =
       "/workspace/llm4binary/github/license_c_cmakelists/Neargye[P]magic_enum/test/3rdparty/Catch2/include/catch2/catch.hpp"
  ;
  local_58.location.line = 0x3817;
  local_28 = (void *)0x0;
  local_88 = (SectionTracker *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<Catch::TestCaseTracking::SectionTracker,std::allocator<Catch::TestCaseTracking::SectionTracker>,Catch::TestCaseTracking::NameAndLocation,Catch::TestCaseTracking::TrackerContext&,decltype(nullptr)>
            (&_Stack_80,&local_88,(allocator<Catch::TestCaseTracking::SectionTracker> *)&local_89,
             &local_58,this,&local_28);
  _Var3._M_pi = _Stack_80._M_pi;
  pSVar2 = local_88;
  local_88 = (SectionTracker *)0x0;
  _Stack_80._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this_00 = (this->m_rootTracker).
            super___shared_ptr<Catch::TestCaseTracking::ITracker,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
  (this->m_rootTracker).
  super___shared_ptr<Catch::TestCaseTracking::ITracker,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)pSVar2;
  (this->m_rootTracker).
  super___shared_ptr<Catch::TestCaseTracking::ITracker,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = _Var3._M_pi;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
    if (_Stack_80._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_80._M_pi);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58.name._M_dataplus._M_p != paVar1) {
    operator_delete(local_58.name._M_dataplus._M_p,local_58.name.field_2._M_allocated_capacity + 1);
  }
  if (local_78 != local_68) {
    operator_delete(local_78,local_68[0] + 1);
  }
  this->m_currentTracker = (ITracker *)0x0;
  this->m_runState = Executing;
  return (this->m_rootTracker).
         super___shared_ptr<Catch::TestCaseTracking::ITracker,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
}

Assistant:

ITracker& TrackerContext::startRun() {
        m_rootTracker = std::make_shared<SectionTracker>( NameAndLocation( "{root}", CATCH_INTERNAL_LINEINFO ), *this, nullptr );
        m_currentTracker = nullptr;
        m_runState = Executing;
        return *m_rootTracker;
    }